

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nw_scan_sse41_128_32.c
# Opt level: O1

parasail_result_t *
parasail_nw_scan_profile_sse41_128_32
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  int *piVar1;
  int *piVar2;
  uint *puVar3;
  void *pvVar4;
  parasail_matrix_t *ppVar5;
  uint uVar6;
  parasail_result_t *ppVar7;
  __m128i *ptr;
  int32_t *ptr_00;
  __m128i *ptr_01;
  __m128i *ptr_02;
  __m128i *ptr_03;
  int iVar8;
  int iVar9;
  uint uVar10;
  int iVar11;
  int iVar12;
  __m128i *palVar13;
  uint uVar14;
  long lVar15;
  int iVar16;
  long lVar17;
  ulong uVar18;
  ulong uVar19;
  int iVar20;
  int iVar21;
  ulong uVar22;
  int iVar23;
  undefined1 auVar24 [16];
  uint uVar26;
  uint uVar27;
  int iVar28;
  uint uVar29;
  undefined1 auVar25 [16];
  uint uVar30;
  uint uVar31;
  uint uVar32;
  uint uVar33;
  uint uVar36;
  undefined1 auVar34 [16];
  int iVar37;
  undefined1 auVar35 [16];
  int32_t iVar38;
  int iVar39;
  int iVar40;
  int iVar41;
  uint uVar42;
  int iVar43;
  uint uVar44;
  int iVar45;
  uint uVar46;
  int iVar47;
  uint uVar48;
  int iVar49;
  int iVar50;
  uint uVar51;
  uint uVar52;
  uint uVar53;
  uint uVar54;
  int iVar55;
  int iVar56;
  int iVar57;
  int iVar58;
  __m128i_32_t e;
  __m128i_32_t h;
  longlong local_58;
  longlong lStack_50;
  longlong local_48;
  longlong lStack_40;
  
  if (profile == (parasail_profile_t *)0x0) {
    parasail_nw_scan_profile_sse41_128_32_cold_8();
  }
  else {
    pvVar4 = (profile->profile32).score;
    if (pvVar4 == (void *)0x0) {
      parasail_nw_scan_profile_sse41_128_32_cold_7();
    }
    else {
      ppVar5 = profile->matrix;
      if (ppVar5 == (parasail_matrix_t *)0x0) {
        parasail_nw_scan_profile_sse41_128_32_cold_6();
      }
      else {
        uVar10 = profile->s1Len;
        if ((int)uVar10 < 1) {
          parasail_nw_scan_profile_sse41_128_32_cold_5();
        }
        else if (s2 == (char *)0x0) {
          parasail_nw_scan_profile_sse41_128_32_cold_4();
        }
        else if (s2Len < 1) {
          parasail_nw_scan_profile_sse41_128_32_cold_3();
        }
        else if (open < 0) {
          parasail_nw_scan_profile_sse41_128_32_cold_2();
        }
        else if (gap < 0) {
          parasail_nw_scan_profile_sse41_128_32_cold_1();
        }
        else {
          iVar16 = uVar10 - 1;
          uVar22 = (ulong)uVar10 + 3 >> 2;
          iVar21 = (int)uVar22;
          iVar23 = -open;
          iVar20 = ppVar5->min;
          uVar10 = 0x80000000 - iVar20;
          if (iVar20 != iVar23 && SBORROW4(iVar20,iVar23) == iVar20 + open < 0) {
            uVar10 = open | 0x80000000;
          }
          uVar6 = 0x7ffffffe - ppVar5->max;
          ppVar7 = parasail_result_new();
          if (ppVar7 != (parasail_result_t *)0x0) {
            ppVar7->flag = ppVar7->flag | 0x4400401;
            ptr = parasail_memalign___m128i(0x10,uVar22);
            ptr_00 = parasail_memalign_int32_t(0x10,(ulong)(s2Len + 1));
            ptr_01 = parasail_memalign___m128i(0x10,uVar22);
            ptr_02 = parasail_memalign___m128i(0x10,uVar22);
            ptr_03 = parasail_memalign___m128i(0x10,uVar22);
            if (ptr_03 != (__m128i *)0x0 &&
                ((ptr_02 != (__m128i *)0x0 && ptr_01 != (__m128i *)0x0) &&
                (ptr_00 != (int32_t *)0x0 && ptr != (__m128i *)0x0))) {
              iVar8 = s2Len + -1;
              iVar9 = 3 - iVar16 / iVar21;
              uVar10 = uVar10 + 1;
              iVar11 = -(iVar21 * gap);
              uVar18 = 0;
              iVar20 = iVar23;
              do {
                lVar15 = 0;
                iVar12 = iVar20;
                do {
                  *(int *)((long)&local_48 + lVar15 * 4) = iVar12;
                  lVar17 = (long)iVar12 - (ulong)(uint)open;
                  if (lVar17 < -0x7fffffff) {
                    lVar17 = -0x80000000;
                  }
                  *(int *)((long)&local_58 + lVar15 * 4) = (int)lVar17;
                  lVar15 = lVar15 + 1;
                  iVar12 = iVar12 - iVar21 * gap;
                } while (lVar15 != 4);
                ptr_02[uVar18][0] = local_48;
                ptr_02[uVar18][1] = lStack_40;
                ptr[uVar18][0] = local_58;
                ptr[uVar18][1] = lStack_50;
                uVar18 = uVar18 + 1;
                iVar20 = iVar20 - gap;
              } while (uVar18 != uVar22);
              *ptr_00 = 0;
              uVar18 = 1;
              do {
                ptr_00[uVar18] = iVar23;
                uVar18 = uVar18 + 1;
                iVar23 = iVar23 - gap;
              } while (s2Len + 1 != uVar18);
              iVar20 = -open;
              iVar23 = -open;
              iVar12 = -open;
              iVar28 = -open;
              palVar13 = ptr_03 + (iVar21 - 1U);
              uVar18 = uVar22;
              do {
                *(int *)*palVar13 = iVar20;
                *(int *)((long)*palVar13 + 4) = iVar23;
                *(int *)(*palVar13 + 1) = iVar12;
                *(int *)((long)*palVar13 + 0xc) = iVar28;
                iVar20 = iVar20 - gap;
                iVar23 = iVar23 - gap;
                iVar12 = iVar12 - gap;
                iVar28 = iVar28 - gap;
                palVar13 = palVar13 + -1;
                iVar50 = (int)uVar18;
                uVar14 = iVar50 - 1;
                uVar18 = (ulong)uVar14;
              } while (uVar14 != 0 && 0 < iVar50);
              palVar13 = ptr_02 + (iVar21 - 1U);
              uVar18 = 1;
              if (1 < s2Len) {
                uVar18 = (ulong)(uint)s2Len;
              }
              lVar15 = (ulong)(iVar21 + (uint)(iVar21 == 0)) << 4;
              uVar19 = 0;
              uVar14 = uVar10;
              uVar26 = uVar10;
              uVar27 = uVar10;
              uVar29 = uVar10;
              uVar30 = uVar6;
              uVar31 = uVar6;
              uVar32 = uVar6;
              uVar33 = uVar6;
              do {
                iVar20 = ppVar5->mapper[(byte)s2[uVar19]];
                uVar42 = uVar10 - (int)(*ptr_03)[0];
                uVar44 = uVar10 - *(int *)((long)*ptr_03 + 4);
                uVar46 = uVar10 - (int)(*ptr_03)[1];
                uVar48 = uVar10 - *(int *)((long)*ptr_03 + 0xc);
                lVar17 = 0;
                iVar38 = ptr_00[uVar19];
                iVar23 = (int)(*palVar13)[0];
                iVar12 = *(int *)((long)*palVar13 + 4);
                iVar28 = (int)(*palVar13)[1];
                auVar35._0_4_ = uVar10;
                auVar35._4_4_ = uVar10;
                auVar35._8_4_ = uVar10;
                uVar36 = uVar10;
                do {
                  piVar1 = (int *)((long)*ptr_02 + lVar17);
                  iVar50 = *piVar1;
                  iVar40 = piVar1[1];
                  iVar41 = piVar1[2];
                  iVar37 = piVar1[3];
                  piVar1 = (int *)((long)*ptr + lVar17);
                  piVar2 = (int *)((long)pvVar4 + lVar17 + (long)iVar20 * uVar22 * 0x10);
                  iVar39 = iVar38 + *piVar2;
                  iVar23 = iVar23 + piVar2[1];
                  iVar12 = iVar12 + piVar2[2];
                  iVar28 = iVar28 + piVar2[3];
                  piVar2 = (int *)((long)*ptr_03 + lVar17);
                  iVar43 = uVar42 + *piVar2;
                  iVar45 = uVar44 + piVar2[1];
                  iVar47 = uVar46 + piVar2[2];
                  iVar49 = uVar48 + piVar2[3];
                  iVar55 = *piVar1 - gap;
                  iVar56 = piVar1[1] - gap;
                  iVar57 = piVar1[2] - gap;
                  iVar58 = piVar1[3] - gap;
                  auVar35._0_4_ =
                       (uint)((int)auVar35._0_4_ < iVar43) * iVar43 |
                       ((int)auVar35._0_4_ >= iVar43) * auVar35._0_4_;
                  auVar35._4_4_ =
                       (uint)((int)auVar35._4_4_ < iVar45) * iVar45 |
                       ((int)auVar35._4_4_ >= iVar45) * auVar35._4_4_;
                  auVar35._8_4_ =
                       (uint)((int)auVar35._8_4_ < iVar47) * iVar47 |
                       ((int)auVar35._8_4_ >= iVar47) * auVar35._8_4_;
                  uVar36 = (uint)((int)uVar36 < iVar49) * iVar49 | ((int)uVar36 >= iVar49) * uVar36;
                  iVar43 = iVar50 - open;
                  iVar45 = iVar40 - open;
                  iVar47 = iVar41 - open;
                  iVar49 = iVar37 - open;
                  uVar51 = (uint)(iVar43 < iVar55) * iVar55 | (uint)(iVar43 >= iVar55) * iVar43;
                  uVar52 = (uint)(iVar45 < iVar56) * iVar56 | (uint)(iVar45 >= iVar56) * iVar45;
                  uVar53 = (uint)(iVar47 < iVar57) * iVar57 | (uint)(iVar47 >= iVar57) * iVar47;
                  uVar54 = (uint)(iVar49 < iVar58) * iVar58 | (uint)(iVar49 >= iVar58) * iVar49;
                  uVar42 = (iVar39 < (int)uVar51) * uVar51 | (uint)(iVar39 >= (int)uVar51) * iVar39;
                  uVar44 = (iVar23 < (int)uVar52) * uVar52 | (uint)(iVar23 >= (int)uVar52) * iVar23;
                  uVar46 = (iVar12 < (int)uVar53) * uVar53 | (uint)(iVar12 >= (int)uVar53) * iVar12;
                  uVar48 = (iVar28 < (int)uVar54) * uVar54 | (uint)(iVar28 >= (int)uVar54) * iVar28;
                  puVar3 = (uint *)((long)*ptr + lVar17);
                  *puVar3 = uVar51;
                  puVar3[1] = uVar52;
                  puVar3[2] = uVar53;
                  puVar3[3] = uVar54;
                  puVar3 = (uint *)((long)*ptr_01 + lVar17);
                  *puVar3 = uVar42;
                  puVar3[1] = uVar44;
                  puVar3[2] = uVar46;
                  puVar3[3] = uVar48;
                  lVar17 = lVar17 + 0x10;
                  iVar38 = iVar50;
                  iVar23 = iVar40;
                  iVar12 = iVar41;
                  iVar28 = iVar37;
                } while (lVar15 != lVar17);
                iVar20 = ptr_00[uVar19 + 1];
                uVar19 = uVar19 + 1;
                iVar23 = (int)(*ptr_03)[0] + iVar20;
                iVar12 = *(int *)((long)*ptr_03 + 4) + uVar42;
                iVar28 = (int)(*ptr_03)[1] + uVar44;
                iVar50 = *(int *)((long)*ptr_03 + 0xc) + uVar46;
                auVar34._0_4_ =
                     (uint)((int)auVar35._0_4_ < iVar23) * iVar23 |
                     ((int)auVar35._0_4_ >= iVar23) * auVar35._0_4_;
                auVar34._4_4_ =
                     (uint)((int)auVar35._4_4_ < iVar12) * iVar12 |
                     ((int)auVar35._4_4_ >= iVar12) * auVar35._4_4_;
                auVar34._8_4_ =
                     (uint)((int)auVar35._8_4_ < iVar28) * iVar28 |
                     ((int)auVar35._8_4_ >= iVar28) * auVar35._8_4_;
                auVar34._12_4_ =
                     (uint)((int)uVar36 < iVar50) * iVar50 | ((int)uVar36 >= iVar50) * uVar36;
                iVar23 = 1;
                do {
                  iVar28 = auVar34._0_4_;
                  iVar12 = iVar28 + iVar11;
                  iVar40 = auVar34._4_4_;
                  iVar41 = auVar34._8_4_;
                  iVar50 = iVar40 + iVar11;
                  iVar37 = iVar41 + iVar11;
                  auVar35._0_4_ =
                       (uint)((int)uVar10 < iVar28) * iVar28 | ((int)uVar10 >= iVar28) * uVar10;
                  auVar35._4_4_ =
                       (uint)(iVar12 < iVar40) * iVar40 | (uint)(iVar12 >= iVar40) * iVar12;
                  auVar35._8_4_ =
                       (uint)(iVar50 < iVar41) * iVar41 | (uint)(iVar50 >= iVar41) * iVar50;
                  iVar12 = auVar34._12_4_;
                  auVar35._12_4_ =
                       (uint)(iVar37 < iVar12) * iVar12 | (uint)(iVar37 >= iVar12) * iVar37;
                  iVar23 = iVar23 + -1;
                  auVar34 = auVar35;
                } while (iVar23 == 0);
                uVar48 = (iVar20 < (int)uVar10) * uVar10 | (uint)(iVar20 >= (int)uVar10) * iVar20;
                uVar42 = ((int)uVar42 < (int)auVar35._0_4_) * auVar35._0_4_ |
                         ((int)uVar42 >= (int)auVar35._0_4_) * uVar42;
                uVar44 = ((int)uVar44 < (int)auVar35._4_4_) * auVar35._4_4_ |
                         ((int)uVar44 >= (int)auVar35._4_4_) * uVar44;
                uVar46 = ((int)uVar46 < (int)auVar35._8_4_) * auVar35._8_4_ |
                         ((int)uVar46 >= (int)auVar35._8_4_) * uVar46;
                lVar17 = 0;
                uVar36 = uVar10;
                do {
                  iVar20 = uVar36 - gap;
                  iVar23 = auVar35._0_4_ - gap;
                  iVar12 = auVar35._4_4_ - gap;
                  iVar28 = auVar35._8_4_ - gap;
                  iVar50 = uVar48 - open;
                  iVar40 = uVar42 - open;
                  iVar41 = uVar44 - open;
                  iVar37 = uVar46 - open;
                  uVar36 = (uint)(iVar20 < iVar50) * iVar50 | (uint)(iVar20 >= iVar50) * iVar20;
                  auVar35._0_4_ =
                       (uint)(iVar23 < iVar40) * iVar40 | (uint)(iVar23 >= iVar40) * iVar23;
                  auVar35._4_4_ =
                       (uint)(iVar12 < iVar41) * iVar41 | (uint)(iVar12 >= iVar41) * iVar12;
                  auVar35._8_4_ =
                       (uint)(iVar28 < iVar37) * iVar37 | (uint)(iVar28 >= iVar37) * iVar28;
                  piVar1 = (int *)((long)*ptr_01 + lVar17);
                  iVar20 = *piVar1;
                  iVar23 = piVar1[1];
                  iVar12 = piVar1[2];
                  iVar28 = piVar1[3];
                  uVar48 = (iVar20 < (int)uVar36) * uVar36 | (uint)(iVar20 >= (int)uVar36) * iVar20;
                  uVar42 = (iVar23 < (int)auVar35._0_4_) * auVar35._0_4_ |
                           (uint)(iVar23 >= (int)auVar35._0_4_) * iVar23;
                  uVar44 = (iVar12 < (int)auVar35._4_4_) * auVar35._4_4_ |
                           (uint)(iVar12 >= (int)auVar35._4_4_) * iVar12;
                  uVar46 = (iVar28 < (int)auVar35._8_4_) * auVar35._8_4_ |
                           (uint)(iVar28 >= (int)auVar35._8_4_) * iVar28;
                  puVar3 = (uint *)((long)*ptr_02 + lVar17);
                  *puVar3 = uVar48;
                  puVar3[1] = uVar42;
                  puVar3[2] = uVar44;
                  puVar3[3] = uVar46;
                  uVar30 = ((int)uVar48 < (int)uVar30) * uVar48 |
                           ((int)uVar48 >= (int)uVar30) * uVar30;
                  uVar31 = ((int)uVar42 < (int)uVar31) * uVar42 |
                           ((int)uVar42 >= (int)uVar31) * uVar31;
                  uVar32 = ((int)uVar44 < (int)uVar32) * uVar44 |
                           ((int)uVar44 >= (int)uVar32) * uVar32;
                  uVar33 = ((int)uVar46 < (int)uVar33) * uVar46 |
                           ((int)uVar46 >= (int)uVar33) * uVar33;
                  uVar14 = ((int)uVar14 < (int)uVar48) * uVar48 |
                           ((int)uVar14 >= (int)uVar48) * uVar14;
                  uVar26 = ((int)uVar26 < (int)uVar42) * uVar42 |
                           ((int)uVar26 >= (int)uVar42) * uVar26;
                  uVar27 = ((int)uVar27 < (int)uVar44) * uVar44 |
                           ((int)uVar27 >= (int)uVar44) * uVar27;
                  uVar29 = ((int)uVar29 < (int)uVar46) * uVar46 |
                           ((int)uVar29 >= (int)uVar46) * uVar29;
                  lVar17 = lVar17 + 0x10;
                } while (lVar15 != lVar17);
              } while (uVar19 != uVar18);
              iVar20 = (iVar16 % iVar21) * 0x10;
              uVar22 = ptr_02[(uint)(iVar16 % iVar21)][0];
              uVar18 = ptr_02[(uint)(iVar16 % iVar21)][1];
              if (iVar16 / iVar21 < 3) {
                iVar20 = 1;
                if (1 < iVar9) {
                  iVar20 = iVar9;
                }
                do {
                  uVar18 = uVar18 << 0x20 | uVar22 >> 0x20;
                  iVar20 = iVar20 + -1;
                  uVar22 = uVar22 << 0x20;
                } while (iVar20 != 0);
              }
              auVar24._0_4_ = -(uint)((int)uVar30 < (int)uVar10);
              auVar24._4_4_ = -(uint)((int)uVar31 < (int)uVar10);
              auVar24._8_4_ = -(uint)((int)uVar32 < (int)uVar10);
              auVar24._12_4_ = -(uint)((int)uVar33 < (int)uVar10);
              auVar25._0_4_ = -(uint)((int)uVar6 < (int)uVar14);
              auVar25._4_4_ = -(uint)((int)uVar6 < (int)uVar26);
              auVar25._8_4_ = -(uint)((int)uVar6 < (int)uVar27);
              auVar25._12_4_ = -(uint)((int)uVar6 < (int)uVar29);
              iVar20 = movmskps(iVar20,auVar25 | auVar24);
              if (iVar20 == 0) {
                iVar20 = (int)(uVar18 >> 0x20);
              }
              else {
                *(byte *)&ppVar7->flag = (byte)ppVar7->flag | 0x40;
                iVar20 = 0;
                iVar8 = 0;
                iVar16 = 0;
              }
              ppVar7->score = iVar20;
              ppVar7->end_query = iVar16;
              ppVar7->end_ref = iVar8;
              parasail_free(ptr_03);
              parasail_free(ptr_02);
              parasail_free(ptr_01);
              parasail_free(ptr_00);
              parasail_free(ptr);
              return ppVar7;
            }
          }
        }
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t s1Len = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m128i* restrict pvP = NULL;
    __m128i* restrict pvE = NULL;
    int32_t* restrict boundary = NULL;
    __m128i* restrict pvHt = NULL;
    __m128i* restrict pvH = NULL;
    __m128i* restrict pvGapper = NULL;
    __m128i vGapO;
    __m128i vGapE;
    int32_t NEG_LIMIT = 0;
    int32_t POS_LIMIT = 0;
    __m128i vZero;
    int32_t score = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vNegInfFront;
    __m128i vSegLenXgap;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile32.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 4; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    pvP = (__m128i*)profile->profile32.score;
    vGapO = _mm_set1_epi32(open);
    vGapE = _mm_set1_epi32(gap);
    NEG_LIMIT = (-open < matrix->min ? INT32_MIN + open : INT32_MIN - matrix->min) + 1;
    POS_LIMIT = INT32_MAX - matrix->max - 1;
    vZero = _mm_setzero_si128();
    score = NEG_LIMIT;
    vNegLimit = _mm_set1_epi32(NEG_LIMIT);
    vPosLimit = _mm_set1_epi32(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vNegInfFront = vZero;
    vNegInfFront = _mm_insert_epi32(vNegInfFront, NEG_LIMIT, 0);
    vSegLenXgap = _mm_add_epi32(vNegInfFront,
            _mm_slli_si128(_mm_set1_epi32(-segLen*gap), 4));

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(segLen*segWidth, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_NW | PARASAIL_FLAG_SCAN
        | PARASAIL_FLAG_BITS_32 | PARASAIL_FLAG_LANES_4;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvE = parasail_memalign___m128i(16, segLen);
    boundary = parasail_memalign_int32_t(16, s2Len+1);
    pvHt= parasail_memalign___m128i(16, segLen);
    pvH = parasail_memalign___m128i(16, segLen);
    pvGapper = parasail_memalign___m128i(16, segLen);

    /* validate heap variables */
    if (!pvE) return NULL;
    if (!boundary) return NULL;
    if (!pvHt) return NULL;
    if (!pvH) return NULL;
    if (!pvGapper) return NULL;

    /* initialize H and E */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m128i_32_t h;
            __m128i_32_t e;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = -open-gap*(segNum*segLen+i);
                h.v[segNum] = tmp < INT32_MIN ? INT32_MIN : tmp;
                tmp = tmp - open;
                e.v[segNum] = tmp < INT32_MIN ? INT32_MIN : tmp;
            }
            _mm_store_si128(&pvH[index], h.m);
            _mm_store_si128(&pvE[index], e.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = -open-gap*(i-1);
            boundary[i] = tmp < INT32_MIN ? INT32_MIN : tmp;
        }
    }

    {
        __m128i vGapper = _mm_sub_epi32(vZero,vGapO);
        for (i=segLen-1; i>=0; --i) {
            _mm_store_si128(pvGapper+i, vGapper);
            vGapper = _mm_sub_epi32(vGapper, vGapE);
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vE;
        __m128i vHt;
        __m128i vF;
        __m128i vH;
        __m128i vHp;
        __m128i *pvW;
        __m128i vW;

        /* calculate E */
        /* calculate Ht */
        /* calculate F and H first pass */
        vHp = _mm_load_si128(pvH+(segLen-1));
        vHp = _mm_slli_si128(vHp, 4);
        vHp = _mm_insert_epi32(vHp, boundary[j], 0);
        pvW = pvP + matrix->mapper[(unsigned char)s2[j]]*segLen;
        vHt = _mm_sub_epi32(vNegLimit, pvGapper[0]);
        vF = vNegLimit;
        for (i=0; i<segLen; ++i) {
            vH = _mm_load_si128(pvH+i);
            vE = _mm_load_si128(pvE+i);
            vW = _mm_load_si128(pvW+i);
            vE = _mm_max_epi32(
                    _mm_sub_epi32(vE, vGapE),
                    _mm_sub_epi32(vH, vGapO));
            vHp = _mm_add_epi32(vHp, vW);
            vF = _mm_max_epi32(vF, _mm_add_epi32(vHt, pvGapper[i]));
            vHt = _mm_max_epi32(vE, vHp);
            _mm_store_si128(pvE+i, vE);
            _mm_store_si128(pvHt+i, vHt);
            vHp = vH;
        }

        /* pseudo prefix scan on F and H */
        vHt = _mm_slli_si128(vHt, 4);
        vHt = _mm_insert_epi32(vHt, boundary[j+1], 0);
        vF = _mm_max_epi32(vF, _mm_add_epi32(vHt, pvGapper[0]));
        for (i=0; i<segWidth-2; ++i) {
            __m128i vFt = _mm_slli_si128(vF, 4);
            vFt = _mm_add_epi32(vFt, vSegLenXgap);
            vF = _mm_max_epi32(vF, vFt);
        }

        /* calculate final H */
        vF = _mm_slli_si128(vF, 4);
        vF = _mm_add_epi32(vF, vNegInfFront);
        vH = _mm_max_epi32(vHt, vF);
        for (i=0; i<segLen; ++i) {
            vHt = _mm_load_si128(pvHt+i);
            vF = _mm_max_epi32(
                    _mm_sub_epi32(vF, vGapE),
                    _mm_sub_epi32(vH, vGapO));
            vH = _mm_max_epi32(vHt, vF);
            _mm_store_si128(pvH+i, vH);
            vSaturationCheckMin = _mm_min_epi32(vSaturationCheckMin, vH);
            vSaturationCheckMax = _mm_max_epi32(vSaturationCheckMax, vH);
#ifdef PARASAIL_TABLE
            arr_store_si128(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif
        } 


#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            vH = _mm_load_si128(pvH + offset);
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 4);
            }
            result->rowcols->score_row[j] = (int32_t) _mm_extract_epi32 (vH, 3);
        }
#endif
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m128i vH = _mm_load_si128(pvH+i);
        arr_store_col(result->rowcols->score_col, vH, i, segLen);
    }
#endif

    /* extract last value from the last column */
    {
        __m128i vH = _mm_load_si128(pvH + offset);
        for (k=0; k<position; ++k) {
            vH = _mm_slli_si128(vH, 4);
        }
        score = (int32_t) _mm_extract_epi32 (vH, 3);
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi32(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi32(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(pvGapper);
    parasail_free(pvH);
    parasail_free(pvHt);
    parasail_free(boundary);
    parasail_free(pvE);

    return result;
}